

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

double __thiscall Character::SpellCooldownTime(Character *this)

{
  double dVar1;
  World *pWVar2;
  mapped_type *this_00;
  double dVar3;
  double dVar4;
  key_type local_40;
  
  pWVar2 = this->world;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SpellCastCooldown","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,&local_40);
  dVar3 = util::variant::GetFloat(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  dVar1 = this->spell_fired_time;
  dVar4 = Timer::GetTime();
  dVar4 = (dVar3 + dVar1) - dVar4;
  dVar3 = 0.0;
  if (0.0 <= dVar4) {
    dVar3 = dVar4;
  }
  return dVar3;
}

Assistant:

double Character::SpellCooldownTime() const
{
	double cooldown_period = this->world->config["SpellCastCooldown"];
	double cooldown = (this->spell_fired_time + cooldown_period) - Timer::GetTime();

	if (cooldown < 0.0)
		cooldown = 0.0;

	return cooldown;
}